

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

TargetOrString * __thiscall
cmGeneratorTarget::ResolveTargetReference
          (TargetOrString *__return_storage_ptr__,cmGeneratorTarget *this,string *name)

{
  long lVar1;
  cmLocalGenerator *pcVar2;
  cmGeneratorTarget *pcVar3;
  cmLocalGenerator *this_00;
  cmDirectoryId dirId;
  string plainName;
  string local_50;
  
  this_00 = this->LocalGenerator;
  lVar1 = std::__cxx11::string::find((char *)name,0x428504);
  plainName._M_dataplus._M_p = (pointer)&plainName.field_2;
  plainName._M_string_length = 0;
  plainName.field_2._M_local_buf[0] = '\0';
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&dirId,(ulong)name);
    std::__cxx11::string::operator=((string *)&plainName,(string *)&dirId);
    std::__cxx11::string::~string((string *)&dirId);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)name);
    cmDirectoryId::cmDirectoryId(&dirId,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar2 = cmGlobalGenerator::FindLocalGenerator(this->GlobalGenerator,&dirId);
    if (pcVar2 != (cmLocalGenerator *)0x0) {
      this_00 = pcVar2;
      name = &plainName;
    }
    std::__cxx11::string::~string((string *)&dirId);
  }
  (__return_storage_ptr__->String)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->String).field_2;
  (__return_storage_ptr__->String)._M_string_length = 0;
  (__return_storage_ptr__->String).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->Target = (cmGeneratorTarget *)0x0;
  pcVar3 = cmLocalGenerator::FindGeneratorTargetToUse(this_00,name);
  if (pcVar3 == (cmGeneratorTarget *)0x0) {
    if (name == &plainName) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&plainName);
    }
    else {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
  else {
    __return_storage_ptr__->Target = pcVar3;
  }
  std::__cxx11::string::~string((string *)&plainName);
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::TargetOrString cmGeneratorTarget::ResolveTargetReference(
  std::string const& name) const
{
  cmLocalGenerator const* lg = this->LocalGenerator;
  std::string const* lookupName = &name;

  // When target_link_libraries() is called with a LHS target that is
  // not created in the calling directory it adds a directory id suffix
  // that we can use to look up the calling directory.  It is that scope
  // in which the item name is meaningful.  This case is relatively rare
  // so we allocate a separate string only when the directory id is present.
  std::string::size_type pos = name.find(CMAKE_DIRECTORY_ID_SEP);
  std::string plainName;
  if (pos != std::string::npos) {
    // We will look up the plain name without the directory id suffix.
    plainName = name.substr(0, pos);

    // We will look up in the scope of the directory id.
    // If we do not recognize the id then leave the original
    // syntax in place to produce an indicative error later.
    cmDirectoryId const dirId =
      name.substr(pos + sizeof(CMAKE_DIRECTORY_ID_SEP) - 1);
    if (cmLocalGenerator const* otherLG =
          this->GlobalGenerator->FindLocalGenerator(dirId)) {
      lg = otherLG;
      lookupName = &plainName;
    }
  }

  TargetOrString resolved;

  if (cmGeneratorTarget* tgt = lg->FindGeneratorTargetToUse(*lookupName)) {
    resolved.Target = tgt;
  } else if (lookupName == &plainName) {
    resolved.String = std::move(plainName);
  } else {
    resolved.String = name;
  }

  return resolved;
}